

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O1

void __thiscall
CoreML::NeuralNetworkShaper::shapeUnidirectionalLSTMLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  size_t sVar1;
  LogMessage *pLVar2;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  undefined1 *puVar5;
  ShapeRange *other;
  mapped_type *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
  *this_01;
  LogFinisher local_239;
  mapped_type *local_238;
  size_t local_230;
  LogMessage local_228;
  LogMessage local_1f0;
  LogMessage local_1b8;
  LogMessage local_180;
  LogMessage local_148;
  LogMessage local_110;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  if ((specLayer->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_1f0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x358);
    pLVar2 = google::protobuf::internal::LogMessage::operator<<
                       (&local_1f0,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_228,pLVar2);
    google::protobuf::internal::LogMessage::~LogMessage(&local_1f0);
  }
  this_01 = &this->blobShapes;
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
           ::operator[](this_01,(key_type *)
                                ((specLayer->input_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_1b8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x358);
    pLVar2 = google::protobuf::internal::LogMessage::operator<<
                       (&local_1b8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_228,pLVar2);
    google::protobuf::internal::LogMessage::~LogMessage(&local_1b8);
  }
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
           ::operator[](this_01,(key_type *)
                                ((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0])
  ;
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_180,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x358);
    pLVar2 = google::protobuf::internal::LogMessage::operator<<
                       (&local_180,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_228,pLVar2);
    google::protobuf::internal::LogMessage::~LogMessage(&local_180);
  }
  ShapeConstraint::setName
            (pmVar4,(string *)((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  if (specLayer->_oneof_case_[0] == 0x1a4) {
    puVar5 = *(undefined1 **)&specLayer->layer_;
  }
  else {
    puVar5 = Specification::_UniDirectionalLSTMLayerParams_default_instance_;
  }
  sVar1 = ((UniDirectionalLSTMLayerParams *)puVar5)->outputvectorsize_;
  ShapeConstraint::setChannel(pmVar3,((SimpleRecurrentLayerParams *)puVar5)->outputvectorsize_);
  ShapeConstraint::setHeight(pmVar3,1);
  ShapeConstraint::setWidth(pmVar3,1);
  ShapeConstraint::setChannel(pmVar4,sVar1);
  ShapeConstraint::setHeight(pmVar4,1);
  ShapeConstraint::setWidth(pmVar4,1);
  puVar5 = (undefined1 *)((BatchnormLayerParams *)puVar5)->variance_;
  if ((WeightParams *)puVar5 == (WeightParams *)0x0) {
    puVar5 = Specification::_LSTMParams_default_instance_;
  }
  if ((char)(((WeightParams *)puVar5)->floatvalue_).total_size_ == '\x01') {
    other = ShapeConstraint::sequenceRange(pmVar3);
    ShapeConstraint::updateSequenceRange(pmVar4,other);
  }
  else {
    ShapeConstraint::setSequence(pmVar4,1);
  }
  if (2 < (specLayer->input_).super_RepeatedPtrFieldBase.current_size_) {
    local_230 = sVar1;
    if ((specLayer->input_).super_RepeatedPtrFieldBase.current_size_ < 2) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_148,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                 ,0x358);
      pLVar2 = google::protobuf::internal::LogMessage::operator<<
                         (&local_148,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_228,pLVar2);
      google::protobuf::internal::LogMessage::~LogMessage(&local_148);
    }
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
             ::operator[](this_01,(key_type *)
                                  ((specLayer->input_).super_RepeatedPtrFieldBase.rep_)->elements[1]
                         );
    if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 2) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_110,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                 ,0x358);
      pLVar2 = google::protobuf::internal::LogMessage::operator<<
                         (&local_110,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_228,pLVar2);
      google::protobuf::internal::LogMessage::~LogMessage(&local_110);
    }
    local_238 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
                ::operator[](this_01,(key_type *)
                                     ((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->
                                     elements[1]);
    if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 2) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_d8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                 ,0x358);
      pLVar2 = google::protobuf::internal::LogMessage::operator<<
                         (&local_d8,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_228,pLVar2);
      google::protobuf::internal::LogMessage::~LogMessage(&local_d8);
    }
    ShapeConstraint::setName
              (local_238,
               (string *)((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[1]);
    if ((specLayer->input_).super_RepeatedPtrFieldBase.current_size_ < 3) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                 ,0x358);
      pLVar2 = google::protobuf::internal::LogMessage::operator<<
                         (&local_a0,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_228,pLVar2);
      google::protobuf::internal::LogMessage::~LogMessage(&local_a0);
    }
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
             ::operator[](this_01,(key_type *)
                                  ((specLayer->input_).super_RepeatedPtrFieldBase.rep_)->elements[2]
                         );
    if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 3) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                 ,0x358);
      pLVar2 = google::protobuf::internal::LogMessage::operator<<
                         (&local_68,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_228,pLVar2);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
    }
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
              ::operator[](this_01,(key_type *)
                                   ((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements
                                   [2]);
    if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 3) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_228,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                 ,0x358);
      pLVar2 = google::protobuf::internal::LogMessage::operator<<
                         (&local_228,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=(&local_239,pLVar2);
      google::protobuf::internal::LogMessage::~LogMessage(&local_228);
    }
    ShapeConstraint::setName
              (this_00,(string *)((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[2]
              );
    ShapeConstraint::setSequence(pmVar3,1);
    sVar1 = local_230;
    ShapeConstraint::setChannel(pmVar3,local_230);
    ShapeConstraint::setHeight(pmVar3,1);
    ShapeConstraint::setWidth(pmVar3,1);
    ShapeConstraint::setSequence(pmVar4,1);
    ShapeConstraint::setChannel(pmVar4,sVar1);
    ShapeConstraint::setHeight(pmVar4,1);
    ShapeConstraint::setWidth(pmVar4,1);
    pmVar3 = local_238;
    ShapeConstraint::setSequence(local_238,1);
    ShapeConstraint::setChannel(pmVar3,sVar1);
    ShapeConstraint::setHeight(pmVar3,1);
    ShapeConstraint::setWidth(pmVar3,1);
    ShapeConstraint::setSequence(this_00,1);
    ShapeConstraint::setChannel(this_00,sVar1);
    ShapeConstraint::setHeight(this_00,1);
    ShapeConstraint::setWidth(this_00,1);
  }
  return;
}

Assistant:

void NeuralNetworkShaper::shapeUnidirectionalLSTMLayer(const Specification::NeuralNetworkLayer& specLayer) {

    //get the input shape
    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Unidirectional LSTM layer " << specLayer.name() << " input shapes (before): " << std::endl;
    for (int i = 0; i < specLayer.input_size(); i++) {
        std::cout << blobShapes[specLayer.input(i)];
    }
    std::cout << "Unidirectional LSTM layer " << specLayer.name() << " output shapes (before): " << std::endl;
    for (int i = 0; i < specLayer.output_size(); i++) {
        std::cout << blobShapes[specLayer.output(i)];
    }
#endif

    const Specification::UniDirectionalLSTMLayerParams& recurrent = specLayer.unidirectionallstm();

    size_t inSize = (size_t)recurrent.inputvectorsize();
    size_t outSize = (size_t)recurrent.outputvectorsize();

    inputShape.setChannel(inSize);
    inputShape.setHeight(1);
    inputShape.setWidth(1);

    outputShape.setChannel(outSize);
    outputShape.setHeight(1);
    outputShape.setWidth(1);
    if (recurrent.params().sequenceoutput()) {
        outputShape.updateSequenceRange(inputShape.sequenceRange());
    }
    else {
        outputShape.setSequence(1);
    }

    if (specLayer.input_size() < 3) {
        return;
    }

    ShapeConstraint& stateInShape = blobShapes[specLayer.input(1)];
    ShapeConstraint& stateOutShape = blobShapes[specLayer.output(1)];
    stateOutShape.setName(specLayer.output(1));

    ShapeConstraint& hiddenInShape = blobShapes[specLayer.input(2)];
    ShapeConstraint& hiddenOutShape = blobShapes[specLayer.output(2)];
    hiddenOutShape.setName(specLayer.output(2));

    stateInShape.setSequence(1);
    stateInShape.setChannel(outSize);
    stateInShape.setHeight(1);
    stateInShape.setWidth(1);

    hiddenInShape.setSequence(1);
    hiddenInShape.setChannel(outSize);
    hiddenInShape.setHeight(1);
    hiddenInShape.setWidth(1);

    stateOutShape.setSequence(1);
    stateOutShape.setChannel(outSize);
    stateOutShape.setHeight(1);
    stateOutShape.setWidth(1);

    hiddenOutShape.setSequence(1);
    hiddenOutShape.setChannel(outSize);
    hiddenOutShape.setHeight(1);
    hiddenOutShape.setWidth(1);

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Unidirectional LSTM layer " << specLayer.name() << " input shapes (after): " << std::endl;
    for (int i = 0; i < specLayer.input_size(); i++) {
        std::cout << blobShapes[specLayer.input(i)];
    }
    std::cout << "Unidirectional LSTM layer " << specLayer.name() << " output shapes (after): " << std::endl;
    for (int i = 0; i < specLayer.output_size(); i++) {
        std::cout << blobShapes[specLayer.output(i)];
    }
#endif

}